

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

Rule * __thiscall pegmatite::Rule::operator=(Rule *this,Rule *r)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  peVar1 = (r->expr).super_shared_ptr<pegmatite::Expr>.
           super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (r->expr).super_shared_ptr<pegmatite::Expr>.
           super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (r->expr).super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (r->expr).super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->expr).super_shared_ptr<pegmatite::Expr>.
            super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->expr).super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->expr).super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return this;
}

Assistant:

Rule& Rule::operator=(Rule &&r)
{
	expr = std::move(r.expr);
	return *this;
}